

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O0

cf_errno_t cf_mutex_destroy(cf_mutex_t *mutex)

{
  int iVar1;
  cf_mutex_t *mutex_local;
  
  iVar1 = pthread_mutex_destroy((pthread_mutex_t *)mutex);
  mutex_local._4_4_ = (uint)(iVar1 != 0);
  return mutex_local._4_4_;
}

Assistant:

cf_errno_t cf_mutex_destroy(cf_mutex_t* mutex) {
#ifdef CF_OS_WIN
    if (!mutex) return CF_EPARAM;   
    return CloseHandle(*mutex) ? CF_OK : CF_NOK;
#else
    if(pthread_mutex_destroy(mutex) == 0) return CF_OK;
    else return CF_NOK;
#endif
}